

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGenerator.cpp
# Opt level: O0

double __thiscall
PyreNet::RandomGenerator::generate_uniform(RandomGenerator *this,double lower,double upper)

{
  result_type_conflict rVar1;
  undefined1 local_40 [8];
  uniform_real_distribution<double> dist;
  unique_lock<std::mutex> lg;
  double upper_local;
  double lower_local;
  RandomGenerator *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&dist._M_param._M_b,(mutex_type *)instanceMutex);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_40,lower,upper);
  rVar1 = std::uniform_real_distribution<double>::operator()
                    ((uniform_real_distribution<double> *)local_40,this->generator);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&dist._M_param._M_b);
  return rVar1;
}

Assistant:

double RandomGenerator::generate_uniform(double lower, double upper) {
        std::unique_lock<std::mutex> lg(instanceMutex);
        std::uniform_real_distribution<double> dist(lower, upper);
        return dist(*generator);
    }